

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

bool __thiscall
IR::BranchInstr::ReplaceTarget
          (BranchInstr *this,LabelInstr *oldLabelInstr,LabelInstr *newLabelInstr)

{
  bool bVar1;
  MultiBranchInstr *this_00;
  LabelInstr *pLVar2;
  LabelInstr *newLabelInstr_local;
  LabelInstr *oldLabelInstr_local;
  BranchInstr *this_local;
  
  bVar1 = IsMultiBranch(this);
  if (bVar1) {
    this_00 = AsMultiBrInstr(this);
    this_local._7_1_ = MultiBranchInstr::ReplaceTarget(this_00,oldLabelInstr,newLabelInstr);
  }
  else {
    pLVar2 = GetTarget(this);
    if (pLVar2 == oldLabelInstr) {
      SetTarget(this,newLabelInstr);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
BranchInstr::ReplaceTarget(IR::LabelInstr * oldLabelInstr, IR::LabelInstr * newLabelInstr)
{
    if (this->IsMultiBranch())
    {
        return this->AsMultiBrInstr()->ReplaceTarget(oldLabelInstr, newLabelInstr);
    }
    if (this->GetTarget() == oldLabelInstr)
    {
        this->SetTarget(newLabelInstr);
        return true;
    }
    return false;
}